

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple9.h
# Opt level: O3

void FastPForLib::Simple9<true,_false>::unpack28_1(uint32_t **out,uint32_t **in)

{
  uint *puVar1;
  uint *puVar2;
  
  puVar1 = *in;
  puVar2 = *out;
  *puVar2 = *puVar1 & 0xfffffff;
  *in = puVar1 + 1;
  *out = puVar2 + 1;
  return;
}

Assistant:

void Simple9<MarkLength, hacked>::unpack28_1(uint32_t **out,
                                             const uint32_t **in) {
  uint32_t *pout;
  const uint32_t *pin;

  pout = *out;
  pin = *in;

  pout[0] = pin[0] & 0x0fffffff;

  *in = pin + 1;
  *out = pout + 1;
}